

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

string * __thiscall
cmOutputConverter::MaybeRelativeTo
          (string *__return_storage_ptr__,cmOutputConverter *this,string *param_1,
          string *remote_path)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  psVar1 = &this->RelativePathTopBinary;
  bVar3 = cmsys::SystemTools::ComparePath(param_1,psVar1);
  bVar5 = true;
  bVar4 = true;
  if (!bVar3) {
    bVar4 = cmsys::SystemTools::IsSubDirectory(param_1,psVar1);
  }
  bVar3 = cmsys::SystemTools::ComparePath(remote_path,psVar1);
  if (!bVar3) {
    bVar5 = cmsys::SystemTools::IsSubDirectory(remote_path,psVar1);
  }
  psVar1 = &this->RelativePathTopSource;
  bVar3 = cmsys::SystemTools::ComparePath(param_1,psVar1);
  bVar7 = true;
  bVar6 = true;
  if (!bVar3) {
    bVar6 = cmsys::SystemTools::IsSubDirectory(param_1,psVar1);
  }
  bVar3 = cmsys::SystemTools::ComparePath(remote_path,psVar1);
  if (!bVar3) {
    bVar7 = cmsys::SystemTools::IsSubDirectory(remote_path,psVar1);
  }
  if (this->RelativePathTopRelation == SrcInBin) {
    bVar4 = (bool)(bVar4 & (bVar6 ^ 1U));
    bVar5 = (bool)(bVar5 & (bVar7 ^ 1U));
  }
  else if (this->RelativePathTopRelation == BinInSrc) {
    bVar6 = (bool)(bVar6 & (bVar4 ^ 1U));
    bVar7 = (bool)(bVar7 & (bVar5 ^ 1U));
  }
  if (((bVar6 & bVar7) == 0) && ((bVar5 & bVar4) == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (remote_path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + remote_path->_M_string_length);
  }
  else {
    cmSystemTools::ForceToRelativePath(__return_storage_ptr__,param_1,remote_path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::MaybeRelativeTo(
  std::string const& local_path, std::string const& remote_path) const
{
  bool localInBinary = PathEqOrSubDir(local_path, this->RelativePathTopBinary);
  bool remoteInBinary =
    PathEqOrSubDir(remote_path, this->RelativePathTopBinary);

  bool localInSource = PathEqOrSubDir(local_path, this->RelativePathTopSource);
  bool remoteInSource =
    PathEqOrSubDir(remote_path, this->RelativePathTopSource);

  switch (this->RelativePathTopRelation) {
    case TopRelation::Separate:
      // Checks are independent.
      break;
    case TopRelation::BinInSrc:
      localInSource = localInSource && !localInBinary;
      remoteInSource = remoteInSource && !remoteInBinary;
      break;
    case TopRelation::SrcInBin:
      localInBinary = localInBinary && !localInSource;
      remoteInBinary = remoteInBinary && !remoteInSource;
      break;
    case TopRelation::InSource:
      // Checks are identical.
      break;
  };

  bool const bothInBinary = localInBinary && remoteInBinary;
  bool const bothInSource = localInSource && remoteInSource;

  if (bothInBinary || bothInSource) {
    return cmSystemTools::ForceToRelativePath(local_path, remote_path);
  }
  return remote_path;
}